

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::constraintJacobianWRTControl
          (LinearConstraint *this,double time,VectorDynSize *param_2,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  element_type *peVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  size_t sVar8;
  ostream *poVar9;
  string *psVar10;
  bool isValid;
  ostringstream errorMsg;
  char local_1d1;
  double local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = time;
  sVar5 = Constraint::constraintSize(&this->super_Constraint);
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,sVar5 & 0xffffffff);
  if (this->m_pimpl->constrainsControl != true) {
    iDynTree::MatrixDynSize::zero();
    return true;
  }
  local_1d1 = '\0';
  peVar1 = (this->m_pimpl->controlConstraintMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  iVar4 = (*peVar1->_vptr_TimeVaryingObject[2])(local_1d0,peVar1,&local_1d1);
  cVar3 = local_1d1;
  if (local_1d1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unable to retrieve a valid control constraint matrix at time: "
               ,0x3e);
    poVar9 = std::ostream::_M_insert<double>(local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
    psVar10 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar2,"constraintJacobianWRTControl",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    goto LAB_0016ff67;
  }
  lVar6 = iDynTree::MatrixDynSize::cols();
  lVar7 = iDynTree::VectorDynSize::size();
  if (lVar6 == lVar7) {
    sVar5 = iDynTree::MatrixDynSize::rows();
    sVar8 = Constraint::constraintSize(&this->super_Constraint);
    if (sVar5 != sVar8) goto LAB_0016fdf2;
  }
  else {
LAB_0016fdf2:
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The control constraint matrix at time: ",0x27);
    poVar9 = std::ostream::_M_insert<double>(local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               " has dimensions not matching with the specified control space dimension or constraint dimension."
               ,0x60);
    psVar10 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar2,"constraintJacobianWRTControl",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  iDynTree::MatrixDynSize::operator=(jacobian,(MatrixDynSize *)CONCAT44(extraout_var,iVar4));
LAB_0016ff67:
  if (cVar3 != '\0') {
    return true;
  }
  return false;
}

Assistant:

bool LinearConstraint::constraintJacobianWRTControl(double time,
                                                  const VectorDynSize& /*state*/,
                                                  const VectorDynSize& control,
                                                  MatrixDynSize& jacobian)
        {
            jacobian.resize(static_cast<unsigned int>(constraintSize()), control.size());

            if (m_pimpl->constrainsControl) {
                bool isValid = false;
                const MatrixDynSize& controlConstraintMatrix = m_pimpl->controlConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "constraintJacobianWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if ((controlConstraintMatrix.cols() != control.size()) || (controlConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control constraint matrix at time: " << time << " has dimensions not matching with the specified control space dimension or constraint dimension.";
                    reportError(name().c_str(), "constraintJacobianWRTControl", errorMsg.str().c_str());
                }

                jacobian = controlConstraintMatrix;
            } else {
                jacobian.zero();
            }

            return true;
        }